

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a28a9::BNTest_NonMinimal_Test::TestBody(BNTest_NonMinimal_Test *this)

{
  UniquePtr<BIGNUM> r;
  int iVar1;
  uint uVar2;
  BIGNUM *a;
  BIO_METHOD *pBVar3;
  BIO *__p;
  AssertHelper *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> p;
  AssertionResult gtest_ar;
  uint8_t *ptr;
  UniquePtr<BN_MONT_CTX> mont;
  ScopedTrace gtest_trace_2544;
  UniquePtr<BN_MONT_CTX> mont3;
  UniquePtr<BIGNUM> ten;
  UniquePtr<BN_MONT_CTX> mont4;
  UniquePtr<BN_MONT_CTX> mont2;
  AssertHelper local_68;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> two_exp_256;
  UniquePtr<BIGNUM> forty_two;
  UniquePtr<BIGNUM> eight;
  UniquePtr<BIGNUM> ten_copy;
  size_t len;
  
  ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)
       ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_st_*,_false>)0x0;
  if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
      ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&p);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x498b79,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ten_copy,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9d9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&ten_copy,(Message *)&p);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = BN_set_word((BIGNUM *)
                        ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,10);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ten_copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           BN_dup((BIGNUM *)
                  ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<bignum_st_*,_bssl::internal::Deleter>)
           ten_copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_bignum_st_*,_false>)0x0;
      if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
          ten_copy._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&p);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"ten_copy","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&eight,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x9dd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&eight,(Message *)&p);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eight);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        eight._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<bignum_st_*,_bssl::internal::Deleter>)
             eight._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_bignum_st_*,_false>)0x0;
        if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
            eight._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&p);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"eight","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&forty_two,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x9e0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&forty_two,(Message *)&p);
LAB_00288d5a:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&forty_two);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
              p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar1 = BN_set_word((BIGNUM *)
                              eight._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,8);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&p);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"BN_set_word(eight.get(), 8)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&forty_two,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x9e1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&forty_two,(Message *)&p);
            goto LAB_00288d5a;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          forty_two._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (tuple<bignum_st_*,_bssl::internal::Deleter>)
               forty_two._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_bignum_st_*,_false>)0x0;
          if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
              forty_two._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&p);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"forty_two",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&two_exp_256,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x9e4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&two_exp_256,(Message *)&p);
LAB_00288e52:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&two_exp_256);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar1 = BN_set_word((BIGNUM *)
                                forty_two._M_t.
                                super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x2a);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar1 != 0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&p);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)"BN_set_word(forty_two.get(), 42)","false","true",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&two_exp_256,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x9e5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&two_exp_256,(Message *)&p)
              ;
              goto LAB_00288e52;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            two_exp_256._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (tuple<bignum_st_*,_bssl::internal::Deleter>)
                 two_exp_256._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_bignum_st_*,_false>)0x0;
            if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
                two_exp_256._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&p);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"two_exp_256"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&zero,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x9e8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)&p);
LAB_00288f4a:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)p._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))()
                ;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                   two_exp_256._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
              a = BN_value_one();
              iVar1 = BN_lshift((BIGNUM *)
                                r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,a,0x100);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar1 != 0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&p);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)"BN_lshift(two_exp_256.get(), BN_value_one(), 256)",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&zero,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x9e9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)&p);
                goto LAB_00288f4a;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (tuple<bignum_st_*,_bssl::internal::Deleter>)
                   zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_bignum_st_*,_false>)0x0;
              if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
                  zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&p);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48c0ff,
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&mont,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x9ec,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                    p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)p._M_t.
                                        super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8)
                  )();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                BN_zero((BIGNUM *)
                        zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                for (mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                          (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                          (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x1;
                    (ulong)mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl < 10;
                    mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                         (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                         ((long)mont._M_t.
                                super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 1)) {
                  testing::ScopedTrace::ScopedTrace<unsigned_long>
                            (&gtest_trace_2544,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x9f0,(unsigned_long *)&mont);
                  iVar1 = bn_resize_words((BIGNUM *)
                                          ten._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                          (size_t)mont._M_t.
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"bn_resize_words(ten.get(), width)","false","true"
                               ,in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont2,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont2,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont2);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  gtest_ar_._0_4_ =
                       mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl._0_4_;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"static_cast<int>(width)","ten->width",
                             (int *)&gtest_ar_,
                             (int *)((long)ten._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                    8));
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f3,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = bn_resize_words((BIGNUM *)
                                          zero._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                          (size_t)mont._M_t.
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"bn_resize_words(zero.get(), width)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont2,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont2,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont2);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  gtest_ar_._0_4_ =
                       mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl._0_4_;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"static_cast<int>(width)","zero->width",
                             (int *)&gtest_ar_,
                             (int *)((long)zero._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                    8));
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f5,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_abs_is_word((BIGNUM *)
                                         ten._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,10)
                  ;
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  bVar5 = iVar1 != 0;
                  gtest_ar_.success_ = bVar5;
                  if (!bVar5) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_abs_is_word(ten.get(), 10)","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont2,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont2,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont2);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_is_word((BIGNUM *)
                                     ten._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,10);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_is_word(ten.get(), 10)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont2,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont2,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont2);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = 10;
                  gtest_ar_._0_8_ =
                       BN_get_word((BIGNUM *)
                                   ten._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            ((internal *)&gtest_ar,"10u","BN_get_word(ten.get())",(uint *)&p,
                             (unsigned_long *)&gtest_ar_);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f9,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_get_u64((BIGNUM *)
                                     ten._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                     (uint64_t *)&mont2);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_get_u64(ten.get(), &v)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
LAB_0028942c:
                    testing::ScopedTrace::~ScopedTrace(&gtest_trace_2544);
                    goto LAB_00289436;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  gtest_ar_._0_4_ = 10;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            ((internal *)&gtest_ar,"10u","v",(uint *)&gtest_ar_,
                             (unsigned_long *)&mont2);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fc,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_equal_consttime((BIGNUM *)
                                             ten._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                             ,(BIGNUM *)
                                              ten_copy._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  bVar5 = iVar1 != 0;
                  gtest_ar_.success_ = bVar5;
                  if (!bVar5) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), ten_copy.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fe,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_equal_consttime((BIGNUM *)
                                             ten_copy._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                             ,(BIGNUM *)
                                              ten._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_equal_consttime(ten_copy.get(), ten.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9ff,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 ten_copy._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(ten.get(), ten_copy.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa00,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 ten_copy._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(ten_copy.get(), ten.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa01,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_equal_consttime((BIGNUM *)
                                             ten._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                             ,(BIGNUM *)
                                              eight._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 == 0;
                  if (iVar1 != 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), eight.get())",
                               "true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa03,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 eight._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(eight.get(), ten.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa04,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 eight._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(ten.get(), eight.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa05,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_equal_consttime((BIGNUM *)
                                             ten._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                             ,(BIGNUM *)
                                              forty_two._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 == 0;
                  if (iVar1 != 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), forty_two.get())",
                               "true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa07,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 forty_two._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(forty_two.get(), ten.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa08,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 forty_two._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(ten.get(), forty_two.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa09,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_equal_consttime((BIGNUM *)
                                             ten._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                             ,(BIGNUM *)
                                              two_exp_256._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 == 0;
                  if (iVar1 != 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), two_exp_256.get())"
                               ,"true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 two_exp_256._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(two_exp_256.get(), ten.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0c,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_cmp((BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 two_exp_256._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_._0_4_ = iVar1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                       ((ulong)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl &
                       0xffffffff00000000);
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)&gtest_ar,"BN_cmp(ten.get(), two_exp_256.get())","0",
                             (int *)&gtest_ar_,(int *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0d,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar_._0_4_ = 4;
                  iVar1 = BN_num_bits((BIGNUM *)
                                      ten._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = iVar1;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)&gtest_ar,"4u","BN_num_bits(ten.get())",(uint *)&gtest_ar_,
                             (uint *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0f,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar_._0_4_ = 1;
                  uVar2 = BN_num_bytes((BIGNUM *)
                                       ten._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = uVar2;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)&gtest_ar,"1u","BN_num_bytes(ten.get())",(uint *)&gtest_ar_
                             ,(uint *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa10,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  iVar1 = BN_is_pow2((BIGNUM *)
                                     ten._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 == 0;
                  if (iVar1 != 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_is_pow2(ten.get())","true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa11,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&mont3,(Message *)&p)
                    ;
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  mont3._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                       BN_bn2hex((BIGNUM *)
                                 ten._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&gtest_ar,"\"0a\"","hex.get()","0a",
                             (char *)mont3._M_t.
                                     super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa14,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  pcVar4 = BN_bn2hex((BIGNUM *)
                                     zero._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&mont3,pcVar4);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&gtest_ar,"\"0\"","hex.get()","0",
                             (char *)mont3._M_t.
                                     super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa16,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  pBVar3 = BIO_s_mem();
                  mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                       BIO_new(pBVar3);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ =
                       (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                       mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
                  if ((tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                      mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                      .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                      (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)0x5104cb,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&ptr,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa19,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&p);
LAB_0028924d:
                    this_00 = (AssertHelper *)&ptr;
LAB_002893ef:
                    testing::internal::AssertHelper::~AssertHelper(this_00);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                        p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)p._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                  + 8))();
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&mont4);
                    std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<char,_bssl::internal::Deleter> *)&mont3);
                    goto LAB_0028942c;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_print((void *)mont4._M_t.
                                           super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                           _M_head_impl,
                                   (BIGNUM *)
                                   ten._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_print(bio.get(), ten.get())","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&ptr,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa1a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&p);
                    goto LAB_0028924d;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BIO_mem_contents((BIO *)mont4._M_t.
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl,&ptr,&len);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BIO_mem_contents(bio.get(), &ptr, &len)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa1d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&p);
LAB_002893e7:
                    this_00 = &local_68;
                    goto LAB_002893ef;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  gtest_ar_._0_8_ = (long)anon_var_dwarf_146c22 + 0xc;
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = ptr._4_4_;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = (int)ptr;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)&gtest_ar,"Bytes(\"a\")","Bytes(ptr, len)",
                             (Bytes *)&gtest_ar_,(Bytes *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa21,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  pBVar3 = BIO_s_mem();
                  __p = BIO_new(pBVar3);
                  std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&mont4,(pointer)__p
                            );
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ =
                       (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                       mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                       (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0;
                  if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                      mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                      .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                      (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)0x5104cb,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa24,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&p);
                    goto LAB_002893e7;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BN_print((void *)mont4._M_t.
                                           super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                           _M_head_impl,
                                   (BIGNUM *)
                                   zero._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_print(bio.get(), zero.get())","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa25,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&p);
                    goto LAB_002893e7;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar1 = BIO_mem_contents((BIO *)mont4._M_t.
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl,&ptr,&len);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar1 != 0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&p);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)"BIO_mem_contents(bio.get(), &ptr, &len)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa26,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&p);
                    goto LAB_002893e7;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  gtest_ar_._0_8_ = anon_var_dwarf_575c;
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x1;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = ptr._4_4_;
                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = (int)ptr;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)&gtest_ar,"Bytes(\"0\")","Bytes(ptr, len)",
                             (Bytes *)&gtest_ar_,(Bytes *)&p);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    pcVar4 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa27,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p,(Message *)&gtest_ar_);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                    if (gtest_ar_._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&mont4);
                  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<char,_bssl::internal::Deleter> *)&mont3);
                  testing::ScopedTrace::~ScopedTrace(&gtest_trace_2544);
                }
                iVar1 = bn_resize_words((BIGNUM *)
                                        ten._M_t.
                                        super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar1 != 0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&p);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"bn_resize_words(ten.get(), 1)","false","true",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)p._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                gtest_ar_._0_4_ = 1;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"1","ten->width",(int *)&gtest_ar_,
                           (int *)((long)ten._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8
                                  ));
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&p,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2c,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&p,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                  if (gtest_ar_._0_8_ != 0) {
                    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                iVar1 = bn_resize_words((BIGNUM *)
                                        ten._M_t.
                                        super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                bVar5 = iVar1 == 0;
                gtest_ar_.success_ = bVar5;
                if (!bVar5) {
                  testing::Message::Message((Message *)&p);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"bn_resize_words(ten.get(), 0)","true","false",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)p._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar1 = BN_is_pow2((BIGNUM *)
                                   eight._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar1 != 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&p);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa31,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)p._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar1 = bn_resize_words((BIGNUM *)
                                        eight._M_t.
                                        super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,4);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar1 != 0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&p);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"bn_resize_words(eight.get(), 4)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa32,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)p._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                gtest_ar_._0_4_ = 4;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"4","eight->width",(int *)&gtest_ar_,
                           (int *)((long)eight._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8
                                  ));
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&p,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa33,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&p,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
                  if (gtest_ar_._0_8_ != 0) {
                    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                iVar1 = BN_is_pow2((BIGNUM *)
                                   eight._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                bVar5 = iVar1 != 0;
                gtest_ar_.success_ = bVar5;
                if (!bVar5) {
                  testing::Message::Message((Message *)&p);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa34,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=((AssertHelper *)&mont,(Message *)&p);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
                      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)p._M_t.
                                          super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                                8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     BN_bin2bn(TestBody::kP,0x20,(BIGNUM *)0x0);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ =
                     (tuple<bignum_st_*,_bssl::internal::Deleter>)
                     p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_bignum_st_*,_false>)0x0;
                if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
                    p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
                    (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
                  testing::Message::Message((Message *)&mont);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mont2,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa3f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&mont2,(Message *)&mont);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont2);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                      mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
                    (**(code **)(*(long *)mont._M_t.
                                          super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                          _M_head_impl + 8))();
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                       BN_MONT_CTX_new_for_modulus
                                 ((BIGNUM *)
                                  p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                  (this->super_BNTest).ctx_._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ =
                       (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                       mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
                  if ((tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                      mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                      (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) {
                    testing::Message::Message((Message *)&mont2);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar,(internal *)&gtest_ar_,
                               (AssertionResult *)0x4db2f4,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mont3,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa45,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&mont3,(Message *)&mont2);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont3);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                        mont2._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
                      (**(code **)(*(long *)mont2._M_t.
                                            super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                            _M_head_impl + 8))();
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                    mont2._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                         (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                         BN_MONT_CTX_new_consttime
                                   ((BIGNUM *)
                                    p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                    (this->super_BNTest).ctx_._M_t.
                                    super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    gtest_ar_.success_ =
                         (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                         mont2._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                         (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
                    if ((tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                        mont2._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                        (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) {
                      testing::Message::Message((Message *)&mont3);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                 (AssertionResult *)"mont2","false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&mont4,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0xa47,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&mont4,(Message *)&mont3);
LAB_00289b6f:
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mont4);
                      std::__cxx11::string::~string((string *)&gtest_ar);
                      if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                          mont3._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                          (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
                        (**(code **)(*(long *)mont3._M_t.
                                              super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                              _M_head_impl + 8))();
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      iVar1 = bn_resize_words((BIGNUM *)
                                              p._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl,0x20);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar1 != 0;
                      if (iVar1 == 0) {
                        testing::Message::Message((Message *)&mont3);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)"bn_resize_words(p.get(), 32)","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&mont4,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa49,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&mont4,(Message *)&mont3);
                        goto LAB_00289b6f;
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      mont3._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t
                      .super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                           (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                           BN_MONT_CTX_new_for_modulus
                                     ((BIGNUM *)
                                      p._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                      (this->super_BNTest).ctx_._M_t.
                                      super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ =
                           (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                           mont3._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                           (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
                      if ((tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                          mont3._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                          (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) {
                        testing::Message::Message((Message *)&mont4);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)"mont3","false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&ptr,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa4c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&ptr,(Message *)&mont4);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                        std::__cxx11::string::~string((string *)&gtest_ar);
                        if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
                            mont4._M_t.
                            super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                            (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
                          (**(code **)(*(long *)mont4._M_t.
                                                super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                _M_head_impl + 8))();
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        mont4._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                             (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                             BN_MONT_CTX_new_consttime
                                       ((BIGNUM *)
                                        p._M_t.
                                        super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                        (this->super_BNTest).ctx_._M_t.
                                        super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                        this_01 = &gtest_ar_.message_;
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        gtest_ar_.success_ =
                             (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                             mont4._M_t.
                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
                             (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
                        if ((tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                            mont4._M_t.
                            super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                            (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) {
                          testing::Message::Message((Message *)&ptr);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                     (AssertionResult *)"mont4","false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&len,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0xa4e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&len,(Message *)&ptr);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
                          std::__cxx11::string::~string((string *)&gtest_ar);
                          if ((long *)CONCAT44(ptr._4_4_,(int)ptr) != (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(ptr._4_4_,(int)ptr) + 8))();
                          }
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(this_01);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont2->N.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont2._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa50,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont3->N.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa51,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont4->N.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont4._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa52,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                          ptr._0_4_ = BN_cmp((BIGNUM *)
                                             mont._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl,
                                             (BIGNUM *)
                                             mont2._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"0","BN_cmp(&mont->RR, &mont2->RR)",
                                     (int *)&gtest_ar_,(int *)&ptr);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa53,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                          ptr._0_4_ = BN_cmp((BIGNUM *)
                                             mont._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl,
                                             (BIGNUM *)
                                             mont3._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"0","BN_cmp(&mont->RR, &mont3->RR)",
                                     (int *)&gtest_ar_,(int *)&ptr);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa54,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                          ptr._0_4_ = BN_cmp((BIGNUM *)
                                             mont._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl,
                                             (BIGNUM *)
                                             mont4._M_t.
                                             super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                             _M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"0","BN_cmp(&mont->RR, &mont4->RR)",
                                     (int *)&gtest_ar_,(int *)&ptr);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa55,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont->RR.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 8));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa56,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont2->RR.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont2._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 8));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa57,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont3->RR.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 8));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa58,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"mont->N.width","mont4->RR.width",
                                     (int *)((long)mont._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 0x20),
                                     (int *)((long)mont4._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bn_mont_ctx_st_*,_false>.
                                                  _M_head_impl + 8));
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&ptr,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa59,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&ptr,(Message *)&gtest_ar_);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                            if (gtest_ar_._0_8_ != 0) {
                              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                            }
                          }
                          this_01 = &gtest_ar.message_;
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(this_01);
                        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                  (&mont4);
                      }
                      std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&mont3);
                    }
                    std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&mont2);
                  }
                  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&mont);
                }
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&p);
              }
LAB_00289436:
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&zero);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&two_exp_256);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&forty_two);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&eight);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&ten_copy);
      goto LAB_00289477;
    }
    testing::Message::Message((Message *)&p);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"BN_set_word(ten.get(), 10)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ten_copy,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9da,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&ten_copy,(Message *)&p);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ten_copy);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_00289477:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&ten);
  return;
}

Assistant:

TEST_F(BNTest, NonMinimal) {
  bssl::UniquePtr<BIGNUM> ten(BN_new());
  ASSERT_TRUE(ten);
  ASSERT_TRUE(BN_set_word(ten.get(), 10));

  bssl::UniquePtr<BIGNUM> ten_copy(BN_dup(ten.get()));
  ASSERT_TRUE(ten_copy);

  bssl::UniquePtr<BIGNUM> eight(BN_new());
  ASSERT_TRUE(eight);
  ASSERT_TRUE(BN_set_word(eight.get(), 8));

  bssl::UniquePtr<BIGNUM> forty_two(BN_new());
  ASSERT_TRUE(forty_two);
  ASSERT_TRUE(BN_set_word(forty_two.get(), 42));

  bssl::UniquePtr<BIGNUM> two_exp_256(BN_new());
  ASSERT_TRUE(two_exp_256);
  ASSERT_TRUE(BN_lshift(two_exp_256.get(), BN_value_one(), 256));

  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(zero);
  BN_zero(zero.get());

  for (size_t width = 1; width < 10; width++) {
    SCOPED_TRACE(width);
    // Make |ten| and |zero| wider.
    EXPECT_TRUE(bn_resize_words(ten.get(), width));
    EXPECT_EQ(static_cast<int>(width), ten->width);
    EXPECT_TRUE(bn_resize_words(zero.get(), width));
    EXPECT_EQ(static_cast<int>(width), zero->width);

    EXPECT_TRUE(BN_abs_is_word(ten.get(), 10));
    EXPECT_TRUE(BN_is_word(ten.get(), 10));
    EXPECT_EQ(10u, BN_get_word(ten.get()));
    uint64_t v;
    ASSERT_TRUE(BN_get_u64(ten.get(), &v));
    EXPECT_EQ(10u, v);

    EXPECT_TRUE(BN_equal_consttime(ten.get(), ten_copy.get()));
    EXPECT_TRUE(BN_equal_consttime(ten_copy.get(), ten.get()));
    EXPECT_EQ(BN_cmp(ten.get(), ten_copy.get()), 0);
    EXPECT_EQ(BN_cmp(ten_copy.get(), ten.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), eight.get()));
    EXPECT_LT(BN_cmp(eight.get(), ten.get()), 0);
    EXPECT_GT(BN_cmp(ten.get(), eight.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), forty_two.get()));
    EXPECT_GT(BN_cmp(forty_two.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), forty_two.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), two_exp_256.get()));
    EXPECT_GT(BN_cmp(two_exp_256.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), two_exp_256.get()), 0);

    EXPECT_EQ(4u, BN_num_bits(ten.get()));
    EXPECT_EQ(1u, BN_num_bytes(ten.get()));
    EXPECT_FALSE(BN_is_pow2(ten.get()));

    bssl::UniquePtr<char> hex(BN_bn2hex(ten.get()));
    EXPECT_STREQ("0a", hex.get());
    hex.reset(BN_bn2hex(zero.get()));
    EXPECT_STREQ("0", hex.get());

    bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), ten.get()));
    const uint8_t *ptr;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    // TODO(davidben): |BN_print| removes leading zeros within a byte, while
    // |BN_bn2hex| rounds up to a byte, except for zero which it prints as
    // "0". Fix this discrepancy?
    EXPECT_EQ(Bytes("a"), Bytes(ptr, len));

    bio.reset(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), zero.get()));
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    EXPECT_EQ(Bytes("0"), Bytes(ptr, len));
  }

  // |ten| may be resized back down to one word.
  EXPECT_TRUE(bn_resize_words(ten.get(), 1));
  EXPECT_EQ(1, ten->width);

  // But not to zero words, which it does not fit.
  EXPECT_FALSE(bn_resize_words(ten.get(), 0));

  EXPECT_TRUE(BN_is_pow2(eight.get()));
  EXPECT_TRUE(bn_resize_words(eight.get(), 4));
  EXPECT_EQ(4, eight->width);
  EXPECT_TRUE(BN_is_pow2(eight.get()));

  // |BN_MONT_CTX| is always stored minimally and uses the same R independent of
  // input width. Additionally, mont->RR is always the same width as mont->N,
  // even if it fits in a smaller value.
  static const uint8_t kP[] = {
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x01,
  };
  bssl::UniquePtr<BIGNUM> p(BN_bin2bn(kP, sizeof(kP), nullptr));
  ASSERT_TRUE(p);

  // Test both the constant-time and variable-time functions at both minimal and
  // non-minimal |p|.
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont);
  bssl::UniquePtr<BN_MONT_CTX> mont2(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont2);

  ASSERT_TRUE(bn_resize_words(p.get(), 32));
  bssl::UniquePtr<BN_MONT_CTX> mont3(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont3);
  bssl::UniquePtr<BN_MONT_CTX> mont4(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont4);

  EXPECT_EQ(mont->N.width, mont2->N.width);
  EXPECT_EQ(mont->N.width, mont3->N.width);
  EXPECT_EQ(mont->N.width, mont4->N.width);
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont2->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont3->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont4->RR));
  EXPECT_EQ(mont->N.width, mont->RR.width);
  EXPECT_EQ(mont->N.width, mont2->RR.width);
  EXPECT_EQ(mont->N.width, mont3->RR.width);
  EXPECT_EQ(mont->N.width, mont4->RR.width);
}